

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

void __thiscall GGSock::Communicator::Data::doRead(Data *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pvVar4;
  size_type sVar5;
  ssize_t sVar6;
  int *piVar7;
  uint *puVar8;
  key_type *__k;
  key_type *pkVar9;
  ulong uVar10;
  size_t sVar11;
  char *pcVar12;
  long in_RDI;
  mapped_type *cb_1;
  TErrorCode errorCode_3;
  TErrorCode errorCode_2;
  int rc_1;
  size_t curSize;
  mapped_type *cb;
  TMessageType type;
  TBufferSize size;
  TErrorCode errorCode_1;
  TErrorCode errorCode;
  int rc;
  undefined8 in_stack_ffffffffffffff58;
  short sVar13;
  function<void_(short)> *in_stack_ffffffffffffff60;
  uint uVar14;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffa0;
  int local_30 [2];
  size_t local_28;
  mapped_type *local_20;
  undefined2 local_16;
  uint local_14;
  undefined2 local_10;
  undefined2 local_e;
  int local_c;
  
  iVar2 = *(int *)(in_RDI + 0x14);
  pvVar4 = std::array<char,_6UL>::data((array<char,_6UL> *)0x13168f);
  sVar5 = std::array<char,_6UL>::size((array<char,_6UL> *)(in_RDI + 0x1180));
  sVar6 = recv(iVar2,pvVar4,sVar5,0);
  sVar13 = (short)((ulong)in_stack_ffffffffffffff58 >> 0x30);
  iVar2 = (int)sVar6;
  local_c = iVar2;
  if (iVar2 < 0) {
    bVar1 = anon_unknown.dwarf_7001::e_wouldBlock();
    if (!bVar1) {
      *(undefined1 *)(in_RDI + 2) = 0;
      anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x1316ea);
      anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x1316f8);
      piVar7 = __errno_location();
      local_e = (undefined2)*piVar7;
      bVar1 = std::function::operator_cast_to_bool((function<void_(short)> *)0x131718);
      if (bVar1) {
        std::function<void_(short)>::operator()(in_stack_ffffffffffffff60,sVar13);
      }
    }
  }
  else if (iVar2 == 0) {
    *(undefined1 *)(in_RDI + 2) = 0;
    *(undefined1 *)(in_RDI + 1) = 0;
    anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x13175e);
    anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x13176c);
    piVar7 = __errno_location();
    local_10 = (undefined2)*piVar7;
    bVar1 = std::function::operator_cast_to_bool((function<void_(short)> *)0x13178c);
    if (bVar1) {
      std::function<void_(short)>::operator()(in_stack_ffffffffffffff60,sVar13);
    }
  }
  else {
    sVar5 = std::array<char,_6UL>::size((array<char,_6UL> *)(in_RDI + 0x1180));
    if (iVar2 == (int)sVar5) {
      local_14 = 0;
      local_16 = 0;
      puVar8 = (uint *)std::array<char,_6UL>::data((array<char,_6UL> *)0x131801);
      local_14 = *puVar8;
      pvVar4 = std::array<char,_6UL>::data((array<char,_6UL> *)0x13181b);
      local_16 = *(undefined2 *)(pvVar4 + 4);
      __k = (key_type *)(ulong)local_14;
      pkVar9 = (key_type *)anon_unknown.dwarf_7001::MessageHeader::getSizeInBytes();
      if (__k == pkVar9) {
        local_20 = std::
                   map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
                   ::operator[]((map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
                                 *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),__k);
        uVar14 = (uint)((ulong)in_stack_ffffffffffffff60 >> 0x20);
        bVar1 = std::function::operator_cast_to_bool
                          ((function<unsigned_short_(const_char_*,_unsigned_int)> *)0x131873);
        if (bVar1) {
          std::vector<char,_std::allocator<char>_>::data
                    ((vector<char,_std::allocator<char>_> *)0x131897);
          std::function<unsigned_short_(const_char_*,_unsigned_int)>::operator()
                    ((function<unsigned_short_(const_char_*,_unsigned_int)> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68,uVar14);
        }
      }
      else {
        uVar10 = (ulong)local_14;
        sVar11 = anon_unknown.dwarf_7001::MessageHeader::getSizeInBytes();
        if (sVar11 < uVar10) {
          *(undefined2 *)(in_RDI + 0x158) = local_16;
          uVar10 = (ulong)local_14;
          sVar11 = anon_unknown.dwarf_7001::MessageHeader::getSizeInBytes();
          *(int *)(in_RDI + 0x154) = (int)uVar10 - (int)sVar11;
          *(undefined4 *)(in_RDI + 0x150) = 0;
          iVar3 = *(int *)(in_RDI + 0x154);
          sVar5 = std::vector<char,_std::allocator<char>_>::size
                            ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x1168));
          if ((int)sVar5 < iVar3) {
            sVar5 = std::vector<char,_std::allocator<char>_>::size
                              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x1168));
            printf("Extend receive buffer to %d bytes\n",sVar5 & 0xffffffff);
            std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)
                       CONCAT44(iVar3,in_stack_ffffffffffffff80),uVar10);
          }
          do {
            while( true ) {
              if (*(int *)(in_RDI + 0x154) < 1) goto LAB_00131b03;
              local_30[1] = 0x10000;
              local_30[0] = *(int *)(in_RDI + 0x154);
              piVar7 = std::min<int>(local_30 + 1,local_30);
              local_28 = (size_t)*piVar7;
              in_stack_ffffffffffffff74 = *(int *)(in_RDI + 0x14);
              pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                  ((vector<char,_std::allocator<char>_> *)0x1319cc);
              sVar6 = recv(in_stack_ffffffffffffff74,pcVar12 + *(int *)(in_RDI + 0x150),local_28,0);
              sVar13 = (short)((ulong)in_stack_ffffffffffffff58 >> 0x30);
              iVar3 = (int)sVar6;
              if (iVar3 < 0) break;
              if (iVar3 == 0) {
                *(undefined1 *)(in_RDI + 2) = 0;
                *(undefined1 *)(in_RDI + 1) = 0;
                anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x131a8b);
                anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x131a99);
                __errno_location();
                bVar1 = std::function::operator_cast_to_bool((function<void_(short)> *)0x131ab6);
                if (!bVar1) {
                  return;
                }
                std::function<void_(short)>::operator()(in_stack_ffffffffffffff60,sVar13);
                return;
              }
              *(int *)(in_RDI + 0x154) = *(int *)(in_RDI + 0x154) - iVar3;
              *(int *)(in_RDI + 0x150) = iVar3 + *(int *)(in_RDI + 0x150);
            }
            bVar1 = anon_unknown.dwarf_7001::e_wouldBlock();
            sVar13 = (short)((ulong)in_stack_ffffffffffffff58 >> 0x30);
          } while (bVar1);
          *(undefined1 *)(in_RDI + 2) = 0;
          anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x131a1d);
          anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x131a2b);
          bVar1 = std::function::operator_cast_to_bool((function<void_(short)> *)0x131a3c);
          if (bVar1) {
            __errno_location();
            std::function<void_(short)>::operator()(in_stack_ffffffffffffff60,sVar13);
          }
LAB_00131b03:
          std::
          map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
          ::operator[]((map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
                        *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),__k);
          bVar1 = std::function::operator_cast_to_bool
                            ((function<unsigned_short_(const_char_*,_unsigned_int)> *)0x131b2b);
          if (bVar1) {
            pcVar12 = std::vector<char,_std::allocator<char>_>::data
                                ((vector<char,_std::allocator<char>_> *)0x131b4b);
            uVar14 = (uint)((ulong)pcVar12 >> 0x20);
            pcVar12 = (char *)(ulong)local_14;
            anon_unknown.dwarf_7001::MessageHeader::getSizeInBytes();
            std::function<unsigned_short_(const_char_*,_unsigned_int)>::operator()
                      ((function<unsigned_short_(const_char_*,_unsigned_int)> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),pcVar12,uVar14)
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void doRead() {
            int rc = (int) recv(sdpeer, bufferHeaderRecv.data(), bufferHeaderRecv.size(), 0);
            if (rc < 0) {
                if (e_wouldBlock() == false) {
                    isConnected = false;
                    ::closeAndReset(sdpeer);
                    ::closeAndReset(sd);

                    TErrorCode errorCode = errno;
                    if (errorCallback) {
                        errorCallback(errorCode);
                    }
                }
                return;
            }

            if (rc == 0) {
                isConnected = false;
                isListening = false;
                ::closeAndReset(sdpeer);
                ::closeAndReset(sd);

                TErrorCode errorCode = errno;
                if (errorCallback) {
                    errorCallback(errorCode);
                }

                return;
            }

            //printf("  %d bytes received, %d %d\n", rc,
            //       (int)(*reinterpret_cast<int32_t *>(bufferHeaderRecv.data())),
            //       (int)(*reinterpret_cast<int16_t *>(bufferHeaderRecv.data() + sizeof(int32_t)))
            //       );

            if (rc == (int) bufferHeaderRecv.size()) {
                TBufferSize size = 0;
                TMessageType type = 0;
                memcpy(&size, bufferHeaderRecv.data(), sizeof(size));
                memcpy(&type, bufferHeaderRecv.data() + sizeof(size), sizeof(type));
                if (size == ::MessageHeader::getSizeInBytes()) {
                    if (const auto & cb = messageCallback[type]) {
                        cb(bufferDataRecv.data(), 0);
                    }
                } else if (size > ::MessageHeader::getSizeInBytes()) {
                    lastMessageType = type;
                    leftToReceive = size - ::MessageHeader::getSizeInBytes();
                    offsetReceive = 0;
                    if (leftToReceive > (int) bufferDataRecv.size()) {
                        printf("Extend receive buffer to %d bytes\n", (int) bufferDataRecv.size());
                        bufferDataRecv.resize(leftToReceive);
                    }

                    while (leftToReceive > 0) {
                        //printf("left = %d\n", (int) leftToReceive);
                        size_t curSize = (std::min)(65536, (int) leftToReceive);

                        int rc = (int) recv(sdpeer, bufferDataRecv.data() + offsetReceive, curSize, 0);
                        if (rc < 0) {
                            if (e_wouldBlock() == false) {
                                isConnected = false;
                                ::closeAndReset(sdpeer);
                                ::closeAndReset(sd);

                                if (errorCallback) {
                                    TErrorCode errorCode = errno;
                                    errorCallback(errorCode);
                                }

                                break;
                            }

                            continue;
                        }

                        if (rc == 0) {
                            isConnected = false;
                            isListening = false;
                            ::closeAndReset(sdpeer);
                            ::closeAndReset(sd);

                            TErrorCode errorCode = errno;
                            if (errorCallback) errorCallback(errorCode);

                            return;
                        }

                        leftToReceive -= rc;
                        offsetReceive += rc;
                    }

                    if (const auto & cb = messageCallback[type]) {
                        cb(bufferDataRecv.data(), size - ::MessageHeader::getSizeInBytes());
                    }
                } else {
                    // error
                }
            }
        }